

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O3

void workload_unrollaccum8(vector<float,_std::allocator<float>_> *data,float *result)

{
  float *pfVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  pointer pfVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  pointer pfVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  pfVar5 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar9 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  uVar8 = (long)pfVar9 - (long)pfVar5;
  if ((uVar8 & 0x1c) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR in ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"workload_unrollaccum8",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": data.size ",0xc);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    pfVar5 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar9 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = (long)pfVar9 - (long)pfVar5;
  }
  if (pfVar9 == pfVar5) {
    fVar14 = 0.0;
  }
  else {
    fVar15 = 0.0;
    fVar16 = 0.0;
    fVar17 = 0.0;
    fVar18 = 0.0;
    uVar10 = 0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    do {
      pfVar1 = pfVar5 + uVar10;
      fVar15 = fVar15 + *pfVar1;
      fVar16 = fVar16 + pfVar1[1];
      fVar17 = fVar17 + pfVar1[2];
      fVar18 = fVar18 + pfVar1[3];
      pfVar1 = pfVar5 + uVar10 + 4;
      fVar11 = fVar11 + *pfVar1;
      fVar12 = fVar12 + pfVar1[1];
      fVar13 = fVar13 + pfVar1[2];
      fVar14 = fVar14 + pfVar1[3];
      uVar10 = uVar10 + 8;
    } while (uVar10 < (ulong)((long)uVar8 >> 2));
    fVar14 = fVar14 + fVar13 + fVar12 + fVar18 + fVar17 + fVar16 + fVar15 + fVar11;
  }
  *result = fVar14;
  lVar6 = std::chrono::_V2::system_clock::now();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&iomutex);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"workload_unrollaccum8",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [cpu ",6);
    iVar2 = sched_getcpu();
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]:\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  processed items: ",0x13);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  elapsed: ",0xb);
    poVar4 = std::ostream::_M_insert<double>((double)(lVar6 - lVar3) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  result: ",10);
    poVar4 = std::ostream::_M_insert<double>((double)*result);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    pthread_mutex_unlock((pthread_mutex_t *)&iomutex);
    return;
  }
  uVar7 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)&iomutex);
  _Unwind_Resume(uVar7);
}

Assistant:

void workload_unrollaccum8(const std::vector<float>& data, float& result) {
  auto t1 = hires_clock::now();
  if (data.size() % 8 != 0) {
    std::cerr
        << "ERROR in " << __func__ << ": data.size " << data.size() << "\n";
  }
  float rt0 = 0;
  float rt1 = 0;
  float rt2 = 0;
  float rt3 = 0;
  float rt4 = 0;
  float rt5 = 0;
  float rt6 = 0;
  float rt7 = 0;
  for (size_t i = 0; i < data.size(); i += 8) {
    rt0 += data[i];
    rt1 += data[i + 1];
    rt2 += data[i + 2];
    rt3 += data[i + 3];
    rt4 += data[i + 4];
    rt5 += data[i + 5];
    rt6 += data[i + 6];
    rt7 += data[i + 7];
  }
  result = rt0 + rt1 + rt2 + rt3 + rt4 + rt5 + rt6 + rt7;

  {
    auto t2 = hires_clock::now();
    std::lock_guard<std::mutex> iolock(iomutex);
    std::cout << __func__ << " [cpu " << sched_getcpu() << "]:\n";
    std::cout << "  processed items: " << data.size() << "\n";
    std::cout << "  elapsed: " << duration_ms(t2 - t1).count() << " ms\n";
    std::cout << "  result: " << result << "\n";
  }
}